

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

long getIncrData(uchar **data,XSelectionEvent *selevent,long lower_bound)

{
  bool bVar1;
  void *pvVar2;
  ulong __n;
  size_t num_bytes;
  long offset;
  uchar *prop;
  unsigned_long bytes_after;
  unsigned_long nitems;
  undefined1 local_100 [4];
  int actual_format;
  Atom actual_type;
  XEvent event;
  size_t total;
  long lower_bound_local;
  XSelectionEvent *selevent_local;
  uchar **data_local;
  
  event.pad[0x17] = 0;
  total = lower_bound;
  lower_bound_local = (long)selevent;
  selevent_local = (XSelectionEvent *)data;
  XDeleteProperty(fl_display,selevent->requestor,selevent->property);
  pvVar2 = realloc(*(void **)selevent_local,total);
  *(void **)selevent_local = pvVar2;
  do {
    do {
      bVar1 = getNextEvent((XEvent *)&actual_type);
      if ((!bVar1) || ((int)actual_type != 0x1c)) goto LAB_0023e856;
    } while (event.xexpose.width != 0);
    offset = 0;
    num_bytes = 0;
    do {
      XGetWindowProperty(fl_display,*(undefined8 *)(lower_bound_local + 0x20),
                         *(undefined8 *)(lower_bound_local + 0x38),num_bytes,70000,1,0,local_100,
                         (long)&nitems + 4,&bytes_after,&prop,&offset);
      __n = bytes_after * (long)(nitems._4_4_ / 8);
      num_bytes = (__n >> 2) + num_bytes;
      if (total < event.pad[0x17] + __n) {
        pvVar2 = realloc(*(void **)selevent_local,event.pad[0x17] + __n);
        *(void **)selevent_local = pvVar2;
      }
      memcpy((void *)(*(long *)selevent_local + event.pad[0x17]),(void *)offset,__n);
      event.pad[0x17] = __n + event.pad[0x17];
      if (offset != 0) {
        XFree(offset);
      }
    } while (prop != (uchar *)0x0);
  } while (__n != 0);
LAB_0023e856:
  XDeleteProperty(fl_display,*(undefined8 *)(lower_bound_local + 0x20),
                  *(undefined8 *)(lower_bound_local + 0x38));
  return event.pad[0x17];
}

Assistant:

static long getIncrData(uchar* &data, const XSelectionEvent& selevent, long lower_bound)
{
//fprintf(stderr,"Incremental transfer starting due to INCR property\n");
  size_t total = 0;
  XEvent event;
  XDeleteProperty(fl_display, selevent.requestor, selevent.property);  
  data = (uchar*)realloc(data, lower_bound);
  for (;;)
  {
    if (!getNextEvent(&event)) break;
    if (event.type == PropertyNotify)
    {
      if (event.xproperty.state != PropertyNewValue) continue;
      Atom actual_type;
      int actual_format;
      unsigned long nitems;
      unsigned long bytes_after;
      unsigned char* prop = 0;
      long offset = 0;
      size_t num_bytes;
      //size_t slice_size = 0;
      do
      {
	XGetWindowProperty(fl_display, selevent.requestor, selevent.property, offset, 70000, True,
			   AnyPropertyType, &actual_type, &actual_format, &nitems, &bytes_after, &prop);
	num_bytes = nitems * (actual_format / 8);
	offset += num_bytes/4;
	//slice_size += num_bytes;
	if (total + num_bytes > (size_t)lower_bound) data = (uchar*)realloc(data, total + num_bytes);
	memcpy(data + total, prop, num_bytes); total += num_bytes;
	if (prop) XFree(prop);
      } while (bytes_after != 0);
//fprintf(stderr,"INCR data size:%ld\n", slice_size);
      if (num_bytes == 0) break;
    }
    else break;
  }
  XDeleteProperty(fl_display, selevent.requestor, selevent.property);
  return (long)total;
}